

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_connection.cc
# Opt level: O3

void __thiscall
QuickConnection::OnMessage
          (QuickConnection *this,string *ip,uint16_t port,uint8_t *data,int16_t data_len)

{
  uint16_t packet_number;
  ushort uVar1;
  uint32_t session_id;
  TaskQueueBase *pTVar2;
  pointer pcVar3;
  ProcessThread *pPVar4;
  AckThread *this_00;
  ReceivedPacket *__ptr;
  int iVar5;
  TaskQueueBase *pTVar6;
  long *plVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ushort *puVar8;
  void *__dest;
  ushort uVar9;
  ulong uVar10;
  ushort sequence_number;
  undefined1 local_70 [8];
  long *local_68;
  int local_60;
  undefined4 uStack_5c;
  long local_58 [2];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  int16_t local_38;
  
  pTVar2 = &this->_thread->super_TaskQueueBase;
  pTVar6 = dd::TaskQueueBase::Current();
  if (pTVar6 != pTVar2) {
    pcVar3 = (ip->_M_dataplus)._M_p;
    local_70 = (undefined1  [8])this;
    local_68 = local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar3,pcVar3 + ip->_M_string_length);
    local_48 = CONCAT22(local_48._2_2_,port);
    pPVar4 = this->_thread;
    uStack_40 = data;
    local_38 = data_len;
    plVar7 = (long *)operator_new(0x48);
    *plVar7 = (long)&PTR__ClosureTask_0012e768;
    plVar7[1] = (long)local_70;
    plVar7[2] = (long)(plVar7 + 4);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(plVar7 + 2),local_68,
               (uint8_t *)((long)local_68 + CONCAT44(uStack_5c,local_60)));
    *(int16_t *)(plVar7 + 8) = local_38;
    *(undefined4 *)(plVar7 + 6) = local_48;
    *(undefined4 *)((long)plVar7 + 0x34) = uStack_44;
    *(undefined4 *)(plVar7 + 7) = (undefined4)uStack_40;
    *(undefined4 *)((long)plVar7 + 0x3c) = uStack_40._4_4_;
    (*(pPVar4->super_TaskQueueBase)._vptr_TaskQueueBase[1])(pPVar4);
    if (plVar7 != (long *)0x0) {
      (**(code **)(*plVar7 + 8))();
    }
    if (local_68 == local_58) {
      return;
    }
    uVar10 = local_58[0] + 1;
    data = (uint8_t *)local_68;
    goto LAB_0011d9d6;
  }
  uVar9 = data_len - 0x11;
  if ((short)uVar9 < 1) {
    local_70 = (undefined1  [8])0x1258b1;
    local_68 = (long *)0x125850;
    local_60 = 0x51;
    LogWrapper::Write(&g_quic_log,(Location *)local_70,2,"process payload failed, payload_len = %d",
                      (ulong)(uint)(int)(short)uVar9);
    if (data == (uint8_t *)0x0) {
      return;
    }
  }
  else {
    iVar5 = (*((this->_clock)._M_t.
               super___uniq_ptr_impl<quic::QuicClock,_std::default_delete<quic::QuicClock>_>._M_t.
               super__Tuple_impl<0UL,_quic::QuicClock_*,_std::default_delete<quic::QuicClock>_>.
               super__Head_base<0UL,_quic::QuicClock_*,_false>._M_head_impl)->_vptr_QuicClock[3])();
    this->_latest_recv_msg_time = CONCAT44(extraout_var,iVar5);
    if (this->_latest_received_timestamp <= *(ulong *)(data + 9)) {
      this->_latest_received_timestamp = *(ulong *)(data + 9);
      this_00 = this->_ack_thread;
      session_id = this->_session_id;
      packet_number = *(uint16_t *)(data + 5);
      iVar5 = (*((this->_clock)._M_t.
                 super___uniq_ptr_impl<quic::QuicClock,_std::default_delete<quic::QuicClock>_>._M_t.
                 super__Tuple_impl<0UL,_quic::QuicClock_*,_std::default_delete<quic::QuicClock>_>.
                 super__Head_base<0UL,_quic::QuicClock_*,_false>._M_head_impl)->_vptr_QuicClock[3])
                        ();
      AckThread::Append(this_00,session_id,packet_number,CONCAT44(extraout_var_00,iVar5));
      sequence_number = *(ushort *)(data + 7);
      uVar1 = this->_expect_recv_sequence_number;
      if ((uint)sequence_number - (uint)uVar1 == 0x8000) {
        if (uVar1 <= sequence_number) {
LAB_0011d93d:
          __ptr = this->_received_packets[sequence_number]._M_t.
                  super___uniq_ptr_impl<ReceivedPacket,_std::default_delete<ReceivedPacket>_>._M_t.
                  super__Tuple_impl<0UL,_ReceivedPacket_*,_std::default_delete<ReceivedPacket>_>.
                  super__Head_base<0UL,_ReceivedPacket_*,_false>._M_head_impl;
          if ((__ptr != (ReceivedPacket *)0x0) && ((uint)__ptr->data_len != (int)(short)uVar9)) {
            __assert_fail("_received_packets[msg->sequence_number].get()->data_len == payload_len",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/quick/quick_connection.cc"
                          ,0x72,
                          "void QuickConnection::OnMessage(const std::string &, uint16_t, const uint8_t *, int16_t)"
                         );
          }
          puVar8 = (ushort *)operator_new(0x10);
          *puVar8 = 0;
          puVar8[4] = 0;
          puVar8[5] = 0;
          puVar8[6] = 0;
          puVar8[7] = 0;
          puVar8[1] = uVar9;
          __dest = operator_new__((ulong)uVar9);
          *(void **)(puVar8 + 4) = __dest;
          memcpy(__dest,data + 0x11,(ulong)uVar9);
          *puVar8 = sequence_number;
          *(ushort **)(this->_received_packets + sequence_number) = puVar8;
          if (__ptr != (ReceivedPacket *)0x0) {
            std::default_delete<ReceivedPacket>::operator()
                      ((default_delete<ReceivedPacket> *)(this->_received_packets + sequence_number)
                       ,__ptr);
            sequence_number = *(ushort *)(data + 7);
          }
        }
      }
      else if (sequence_number == uVar1 || -1 < (short)((uint)sequence_number - (uint)uVar1))
      goto LAB_0011d93d;
      DeliverReceivedPackets(this,sequence_number);
    }
  }
  uVar10 = 1;
LAB_0011d9d6:
  operator_delete(data,uVar10);
  return;
}

Assistant:

void QuickConnection::OnMessage(const std::string &ip, uint16_t port, const uint8_t* data, int16_t data_len)
{
	if (!_thread->IsCurrent()) {
		PostTask([this, ip, port, data, data_len] {
			OnMessage(ip, port, data, data_len);
		});
		return;
	}
	std::unique_ptr<uint8_t> packet(const_cast<uint8_t*>(data));

	QuickPayload *msg = (QuickPayload*)data;
	int16_t payload_len = data_len - sizeof(QuickPayload) + 1;
	if (payload_len <= 0) {
		g_quic_log.Write(RTC_FROM_HERE, LOG_LEVEL_INFO, "process payload failed, payload_len = %d", payload_len);
		return;
	}

	_latest_recv_msg_time = _clock->Now().ToDebuggingValue();

	// udp�������������£������� send_timestamp��_latest_received_timestampС�����������������İ�ֱ�ӽ��ж�������ack����Ҫ�ظ���
	// ���Ͷ��ڷ���ʱ��send_timestamp���ϸ񵥵������ģ������İ��ɷ��Ͱ������ش����ɡ�
	// һ�������£�ֻ������·�ɷ����仯�������£�udp���ſ��ܻ������������������������������������������շ�����ʱ��
	// ���������������޵�����Ҳ���п��ܳ���������
	if (msg->send_timestamp < _latest_received_timestamp)
		return;
	_latest_received_timestamp = msg->send_timestamp;

#ifdef OUTPUT_VERBOSE_INFO
	dd::OutputDebugInfo("recv packet, packet number = %u, sequence number = %u, len = %d, now = %llu\r\n", msg->packet_number, msg->sequence_number,
			payload_len, _clock->Now().ToDebuggingValue());
#endif

	uint64_t timestamp = 0;
	memcpy(&timestamp, msg->payload, sizeof(&time));
	PacketInfo info(msg->sequence_number, payload_len, timestamp, _expect_recv_sequence_number, msg->packet_number);
	//_real_recv_packets_len[timestamp] = info;
#ifdef OUTPUT_DEBUG_INFO
		_real_recv_packets_len.push_back(info);
#endif

	_ack_thread->Append(_session_id, msg->packet_number, _clock->Now().ToDebuggingValue());

	// ֻ�бȵ�ǰ�������յ����Ÿ��µİ��ŷ��뵽���塣
	// �ش��������£�sequence_number���ܻ��� _expect_recv_sequence_number����
	if (quic::IsNewer(msg->sequence_number, _expect_recv_sequence_number) || msg->sequence_number == _expect_recv_sequence_number) {
		if(_received_packets[msg->sequence_number].get())
			assert(_received_packets[msg->sequence_number].get()->data_len == payload_len);
		_received_packets[msg->sequence_number].reset(new ReceivedPacket(msg->sequence_number, msg->payload, payload_len));

	}

	DeliverReceivedPackets(msg->sequence_number);
}